

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readasy.c
# Opt level: O0

int it_asy_read_sample_header(IT_SAMPLE *sample,DUMBFILE *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int32 iVar4;
  DUMBFILE *in_RSI;
  long in_RDI;
  double dVar5;
  int key_offset;
  int finetune;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  dumbfile_getnc((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (int32)((ulong)in_RDI >> 0x20),in_RSI);
  *(undefined1 *)(in_RDI + 0x16) = 0;
  *(undefined1 *)(in_RDI + 0x23) = 0;
  iVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar2 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 0x34) = (char)iVar2;
  *(undefined1 *)(in_RDI + 0x33) = 0x40;
  if (0x40 < *(byte *)(in_RDI + 0x34)) {
    *(undefined1 *)(in_RDI + 0x34) = 0x40;
  }
  iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar4 = dumbfile_igetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(int32 *)(in_RDI + 0x38) = iVar4;
  iVar4 = dumbfile_igetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(int32 *)(in_RDI + 0x3c) = iVar4;
  iVar2 = *(int *)(in_RDI + 0x3c);
  iVar4 = dumbfile_igetl((DUMBFILE *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
  *(int *)(in_RDI + 0x40) = iVar2 + iVar4;
  if (*(int *)(in_RDI + 0x38) < 1) {
    *(undefined1 *)(in_RDI + 0x32) = 0;
    iVar1 = 0;
  }
  else {
    *(undefined1 *)(in_RDI + 0x32) = 1;
    *(undefined1 *)(in_RDI + 0x35) = 0;
    dVar5 = pow(1.0594630943592953,(double)(int)(char)iVar3);
    *(int *)(in_RDI + 0x44) = (int)(dVar5 * 16574.27570093458);
    *(short *)(in_RDI + 0x54) = (short)(((int)(char)(iVar1 << 4) >> 4) << 5);
    if ((2 < *(int *)(in_RDI + 0x40) - *(int *)(in_RDI + 0x3c)) &&
       (*(int *)(in_RDI + 0x40) <= *(int *)(in_RDI + 0x38))) {
      *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) | 0x10;
    }
    *(undefined1 *)(in_RDI + 0x50) = 0;
    *(undefined1 *)(in_RDI + 0x51) = 0;
    *(undefined1 *)(in_RDI + 0x52) = 0;
    *(undefined1 *)(in_RDI + 0x53) = 0;
    *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
    iVar1 = dumbfile_error(in_RSI);
  }
  return iVar1;
}

Assistant:

static int it_asy_read_sample_header( IT_SAMPLE *sample, DUMBFILE *f )
{
	int finetune, key_offset;

/**
     21       22   Chars     Sample 1 name.  If the name is not a full
                             22 chars in length, it will be null
                             terminated.

If
the sample name begins with a '#' character (ASCII $23 (35)) then this is
assumed not to be an instrument name, and is probably a message.
*/
    dumbfile_getnc( (char *) sample->name, 22, f );
	sample->name[22] = 0;

	sample->filename[0] = 0;

/** Each  finetune step changes  the note 1/8th  of  a  semitone. */
	finetune = ( signed char ) ( dumbfile_getc( f ) << 4 ) >> 4; /* signed nibble */
	sample->default_volume = dumbfile_getc( f ); // Should we be setting global_volume to this instead?
	sample->global_volume = 64;
	if ( sample->default_volume > 64 ) sample->default_volume = 64;
	key_offset = ( signed char ) dumbfile_getc( f ); /* base key offset */
	sample->length = dumbfile_igetl( f );
	sample->loop_start = dumbfile_igetl( f );
	sample->loop_end = sample->loop_start + dumbfile_igetl( f );

	if ( sample->length <= 0 ) {
		sample->flags = 0;
		return 0;
	}

	sample->flags = IT_SAMPLE_EXISTS;

	sample->default_pan = 0;
	sample->C5_speed = (int)( AMIGA_CLOCK / 214.0 * pow( DUMB_SEMITONE_BASE, key_offset ) );//( long )( 16726.0 * pow( DUMB_PITCH_BASE, finetune * 32 ) );
	sample->finetune = finetune * 32;
	// the above line might be wrong

	if ( ( sample->loop_end - sample->loop_start > 2 ) && ( sample->loop_end <= sample->length ) )
		sample->flags |= IT_SAMPLE_LOOP;

	sample->vibrato_speed = 0;
	sample->vibrato_depth = 0;
	sample->vibrato_rate = 0;
	sample->vibrato_waveform = 0; // do we have to set _all_ these?
	sample->max_resampling_quality = -1;

	return dumbfile_error(f);
}